

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O0

void sptk::world::anon_unknown_2::GetMainWindow
               (double current_position,int *base_index,int base_time_length,double fs,
               double window_length_in_time,double *main_window)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  int i;
  double tmp;
  undefined4 local_3c;
  
  for (local_3c = 0; local_3c < in_ESI; local_3c = local_3c + 1) {
    dVar1 = ((double)*(int *)(in_RDI + (long)local_3c * 4) - 1.0) / in_XMM1_Qa - in_XMM0_Qa;
    dVar2 = cos((dVar1 * 6.283185307179586) / in_XMM2_Qa);
    dVar1 = cos((dVar1 * 12.566370614359172) / in_XMM2_Qa);
    *(double *)(in_RDX + (long)local_3c * 8) = dVar1 * 0.08 + dVar2 * 0.5 + 0.42;
  }
  return;
}

Assistant:

static void GetMainWindow(double current_position, const int *base_index,
    int base_time_length, double fs, double window_length_in_time,
    double *main_window) {
  double tmp = 0.0;
  for (int i = 0; i < base_time_length; ++i) {
    tmp = (base_index[i] - 1.0) / fs - current_position;
    main_window[i] = 0.42 +
      0.5 * cos(2.0 * world::kPi * tmp / window_length_in_time) +
      0.08 * cos(4.0 * world::kPi * tmp / window_length_in_time);
  }
}